

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_paeth_predictor_32x8_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong *in_RCX;
  long in_RSI;
  undefined8 *in_RDI;
  __m128i *top1;
  undefined8 extraout_XMM0_Qa;
  __m128i *top0;
  __m128i *extraout_XMM0_Qb;
  __m128i r32h;
  __m128i r32l;
  int i;
  __m128i l16;
  __m128i l;
  __m128i one;
  __m128i rep;
  __m128i tl16;
  __m128i bh;
  __m128i bl;
  __m128i ah;
  __m128i al;
  __m128i zero;
  __m128i b;
  __m128i a;
  __m128i *in_stack_fffffffffffffd40;
  __m128i *in_stack_fffffffffffffd48;
  __m128i *in_stack_fffffffffffffd50;
  __m128i *in_stack_fffffffffffffd58;
  int local_29c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_1c0;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  
  local_268 = 0x8000800080008000;
  uStack_260 = 0x8000800080008000;
  uVar1 = *in_RCX;
  local_1c0 = in_RDI;
  for (local_29c = 0; local_29c < 8; local_29c = local_29c + 1) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar1;
    auVar2._8_8_ = uStack_260;
    auVar2._0_8_ = local_268;
    pshufb(auVar3,auVar2);
    paeth_16x1_pred(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                    in_stack_fffffffffffffd40);
    in_stack_fffffffffffffd48 = top1;
    in_stack_fffffffffffffd50 = top0;
    paeth_16x1_pred(in_stack_fffffffffffffd58,top0,top1,in_stack_fffffffffffffd40);
    *local_1c0 = in_stack_fffffffffffffd48;
    local_1c0[1] = in_stack_fffffffffffffd50;
    local_1c0[2] = extraout_XMM0_Qa;
    local_1c0[3] = extraout_XMM0_Qb;
    local_1c0 = (undefined8 *)(in_RSI + (long)local_1c0);
    local_108 = (short)local_268;
    sStack_106 = (short)((ulong)local_268 >> 0x10);
    sStack_104 = (short)((ulong)local_268 >> 0x20);
    sStack_102 = (short)((ulong)local_268 >> 0x30);
    sStack_100 = (short)uStack_260;
    sStack_fe = (short)((ulong)uStack_260 >> 0x10);
    sStack_fc = (short)((ulong)uStack_260 >> 0x20);
    sStack_fa = (short)((ulong)uStack_260 >> 0x30);
    local_268 = CONCAT26(sStack_102 + 1,
                         CONCAT24(sStack_104 + 1,CONCAT22(sStack_106 + 1,local_108 + 1)));
    uStack_260 = CONCAT26(sStack_fa + 1,
                          CONCAT24(sStack_fc + 1,CONCAT22(sStack_fe + 1,sStack_100 + 1)));
    in_stack_fffffffffffffd40 = extraout_XMM0_Qb;
  }
  return;
}

Assistant:

void aom_paeth_predictor_32x8_ssse3(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);
  const __m128i l = _mm_loadl_epi64((const __m128i *)left);
  __m128i l16;

  for (int i = 0; i < 8; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i r32l = paeth_16x1_pred(&l16, &al, &ah, &tl16);
    const __m128i r32h = paeth_16x1_pred(&l16, &bl, &bh, &tl16);

    _mm_store_si128((__m128i *)dst, r32l);
    _mm_store_si128((__m128i *)(dst + 16), r32h);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}